

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

InternalKey * __thiscall leveldb::InternalKey::DebugString_abi_cxx11_(InternalKey *this)

{
  bool bVar1;
  string *in_RSI;
  Slice local_b0;
  leveldb local_a0 [32];
  ParsedInternalKey local_80;
  Slice local_60 [2];
  undefined1 local_40 [8];
  ParsedInternalKey parsed;
  InternalKey *this_local;
  string *result;
  
  parsed._31_1_ = 0;
  std::__cxx11::string::string((string *)this);
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)local_40);
  Slice::Slice(local_60,in_RSI);
  bVar1 = ParseInternalKey(local_60,(ParsedInternalKey *)local_40);
  if (bVar1) {
    ParsedInternalKey::DebugString_abi_cxx11_(&local_80);
    std::__cxx11::string::operator=((string *)this,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    std::__cxx11::string::operator=((string *)this,"(bad)");
    Slice::Slice(&local_b0,in_RSI);
    EscapeString_abi_cxx11_(local_a0,&local_b0);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_a0);
  }
  return this;
}

Assistant:

std::string InternalKey::DebugString() const {
        std::string result;
        ParsedInternalKey parsed;
        if (ParseInternalKey(rep_, &parsed)) {
            result = parsed.DebugString();
        } else {
            result = "(bad)";
            result.append(EscapeString(rep_));
        }
        return result;
    }